

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_MXF.cpp
# Opt level: O0

ASDCP * __thiscall
ASDCP::MD_to_CryptoInfo(ASDCP *this,CryptographicContext *InfoObj,WriterInfo *Info,Dictionary *Dict)

{
  undefined8 uVar1;
  bool bVar2;
  byte_t *pbVar3;
  ILogSink *this_00;
  undefined1 local_68 [8];
  UL MIC_NONE;
  UL MIC_SHA1;
  Dictionary *Dict_local;
  WriterInfo *Info_local;
  CryptographicContext *InfoObj_local;
  
  if (InfoObj == (CryptographicContext *)0x0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
    return this;
  }
  Info->EncryptedEssence = true;
  pbVar3 = Kumu::Identifier<16U>::Value(&(InfoObj->ContextID).super_Identifier<16U>);
  uVar1 = *(undefined8 *)(pbVar3 + 8);
  *(undefined8 *)Info->ContextID = *(undefined8 *)pbVar3;
  *(undefined8 *)(Info->ContextID + 8) = uVar1;
  pbVar3 = Kumu::Identifier<16U>::Value(&(InfoObj->CryptographicKeyID).super_Identifier<16U>);
  uVar1 = *(undefined8 *)(pbVar3 + 8);
  *(undefined8 *)Info->CryptographicKeyID = *(undefined8 *)pbVar3;
  *(undefined8 *)(Info->CryptographicKeyID + 8) = uVar1;
  pbVar3 = Dictionary::ul(Dict,MDD_MICAlgorithm_HMAC_SHA1);
  UL::UL((UL *)(MIC_NONE.super_Identifier<16U>.m_Value + 0xf),pbVar3);
  pbVar3 = Dictionary::ul(Dict,MDD_MICAlgorithm_NONE);
  UL::UL((UL *)local_68,pbVar3);
  bVar2 = UL::operator==(&InfoObj->MICAlgorithm,(UL *)(MIC_NONE.super_Identifier<16U>.m_Value + 0xf)
                        );
  if (bVar2) {
    Info->UsesHMAC = true;
  }
  else {
    bVar2 = UL::operator==(&InfoObj->MICAlgorithm,(UL *)local_68);
    if (!bVar2) {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(this_00,"Unexpected MICAlgorithm UL.\n");
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)RESULT_FORMAT);
      goto LAB_0029257f;
    }
    Info->UsesHMAC = false;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
LAB_0029257f:
  UL::~UL((UL *)local_68);
  UL::~UL((UL *)(MIC_NONE.super_Identifier<16U>.m_Value + 0xf));
  return this;
}

Assistant:

Result_t
ASDCP::MD_to_CryptoInfo(CryptographicContext* InfoObj, WriterInfo& Info, const Dictionary& Dict)
{
  ASDCP_TEST_NULL(InfoObj);

  Info.EncryptedEssence = true;
  memcpy(Info.ContextID, InfoObj->ContextID.Value(), UUIDlen);
  memcpy(Info.CryptographicKeyID, InfoObj->CryptographicKeyID.Value(), UUIDlen);

  UL MIC_SHA1(Dict.ul(MDD_MICAlgorithm_HMAC_SHA1));
  UL MIC_NONE(Dict.ul(MDD_MICAlgorithm_NONE));

  if ( InfoObj->MICAlgorithm == MIC_SHA1 )
    Info.UsesHMAC = true;

  else if ( InfoObj->MICAlgorithm == MIC_NONE )
    Info.UsesHMAC = false;

  else
    {
      DefaultLogSink().Error("Unexpected MICAlgorithm UL.\n");
      return RESULT_FORMAT;
    }

  return RESULT_OK;
}